

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O1

void __thiscall diy::Link::~Link(Link *this)

{
  pointer pBVar1;
  
  (this->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014f670;
  pBVar1 = (this->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1,(long)(this->neighbors_).
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pBVar1);
    return;
  }
  return;
}

Assistant:

Link&     operator=(Link&&)                   = default;